

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O2

void sha1_loop(sha1_ctxt *ctxt,uchar *input,size_t len)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong __n;
  
  for (uVar3 = 0; uVar2 = len - uVar3, uVar3 <= len && uVar2 != 0; uVar3 = uVar3 + __n) {
    uVar4 = (ulong)(ctxt->count & 0x3f);
    __n = 0x40 - uVar4;
    if (uVar2 <= __n) {
      __n = uVar2;
    }
    memcpy((void *)((long)&ctxt->m + uVar4),input + uVar3,__n);
    (ctxt->c).b64[0] = (ctxt->c).b64[0] + (ulong)(uint)((int)__n * 8);
    bVar1 = ctxt->count + (char)__n & 0x3f;
    ctxt->count = bVar1;
    if (bVar1 == 0) {
      sha1_step(ctxt);
    }
  }
  return;
}

Assistant:

void
sha1_loop(struct sha1_ctxt *ctxt, const unsigned char *input, size_t len)
{
	size_t off;

	off = 0;

	while (off < len) {
		size_t gapstart = COUNT % 64, gaplen = 64 - gapstart,
		       copysiz = (gaplen < len - off) ? gaplen : len - off;

		memcpy(&ctxt->m.b8[gapstart], &input[off], copysiz);
		COUNT = (unsigned char)(COUNT + copysiz);
		COUNT %= 64;
		ctxt->c.b64[0] += copysiz * 8;
		if (COUNT % 64 == 0)
			sha1_step(ctxt);
		off += copysiz;
	}
}